

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerNewScObjArrayNoArg(Lowerer *this,Instr *newObjInstr)

{
  ProfileId index;
  OpCode opcode;
  Func *pFVar1;
  Lowerer *this_00;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  byte bVar5;
  BailOutKind BVar6;
  int iVar7;
  undefined4 *puVar8;
  JITTimeFunctionBody *pJVar9;
  JITTimeProfileInfo *pJVar10;
  intptr_t weakFuncRef;
  undefined4 extraout_var;
  Opnd *dstOpnd;
  Opnd *src1Opnd;
  ProfiledInstr *instr;
  LabelInstr *pLVar12;
  AddrOpnd *pAVar13;
  HelperCallOpnd *this_01;
  Instr *pIVar14;
  ArrayCallSiteInfo *arrayInfo;
  intptr_t arrayInfoAddr;
  Instr *local_48;
  Lowerer *pLVar11;
  
  pFVar1 = newObjInstr->m_func;
  this_00 = (Lowerer *)newObjInstr->m_src1;
  pLVar11 = this_00;
  OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar3 == OpndKindAddr) {
    local_48 = InsertLoweredRegionStartMarker(pLVar11,newObjInstr);
    instr = (ProfiledInstr *)newObjInstr;
  }
  else {
    if (((newObjInstr->field_0x38 & 0x10) == 0) ||
       (pLVar11 = (Lowerer *)newObjInstr, bVar4 = IR::Instr::OnlyHasLazyBailOut(newObjInstr), bVar4)
       ) {
      pIVar14 = LowerNewScObject(this,newObjInstr,true,false,false);
      return pIVar14;
    }
    local_48 = InsertLoweredRegionStartMarker(pLVar11,newObjInstr);
    BVar6 = IR::Instr::GetBailOutKind(newObjInstr);
    if ((BVar6 != BailOutOnNotNativeArray) &&
       (BVar6 = IR::Instr::GetBailOutKind(newObjInstr),
       BVar6 != (LazyBailOut|BailOutOnNotNativeArray))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1511,
                         "(newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray))"
                         ,
                         "newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)"
                        );
      if (!bVar4) goto LAB_005cd967;
      *puVar8 = 0;
    }
    pLVar12 = IR::LabelInstr::New(Label,pFVar1,false);
    iVar7 = (*newObjInstr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x10])();
    pLVar11 = (Lowerer *)CONCAT44(extraout_var,iVar7);
    pAVar13 = IR::AddrOpnd::New((intptr_t)pLVar11,AddrOpndKindDynamicVar,newObjInstr->m_func,false,
                                (Var)0x0);
    InsertCompareBranch(pLVar11,(Opnd *)this_00,&pAVar13->super_Opnd,BrEq_A,true,pLVar12,newObjInstr
                        ,false);
    opcode = newObjInstr->m_opcode;
    dstOpnd = IR::Instr::UnlinkDst(newObjInstr);
    src1Opnd = IR::Instr::UnlinkSrc1(newObjInstr);
    instr = IR::ProfiledInstr::New(opcode,dstOpnd,src1Opnd,pFVar1);
    if (newObjInstr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar4) goto LAB_005cd967;
      *puVar8 = 0;
    }
    (instr->u).profileId = *(uint *)&newObjInstr[1]._vptr_Instr;
    IR::Instr::InsertAfter(newObjInstr,&instr->super_Instr);
    newObjInstr->m_opcode = BailOut;
    GenerateBailOut(this,newObjInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    IR::Instr::InsertBefore(&instr->super_Instr,&pLVar12->super_Instr);
  }
  if ((instr->super_Instr).m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x152c,"(newObjInstr->IsProfiledInstr())","newObjInstr->IsProfiledInstr()");
    if (!bVar4) goto LAB_005cd967;
    *puVar8 = 0;
  }
  if ((instr->super_Instr).m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
    if (!bVar4) goto LAB_005cd967;
    *puVar8 = 0;
  }
  index = (instr->u).field_3.fldInfoData.f1;
  weakFuncRef = 0;
  arrayInfoAddr = 0;
  arrayInfo = (ArrayCallSiteInfo *)0x0;
  if (index != 0xffff) {
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(pFVar1->m_workItem);
    pJVar10 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar9);
    arrayInfo = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar10,index);
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(pFVar1->m_workItem);
    pJVar10 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar9);
    arrayInfoAddr = JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar10,index);
    if (arrayInfo == (ArrayCallSiteInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1536,"(arrayInfo)","arrayInfo");
      if (!bVar4) goto LAB_005cd967;
      *puVar8 = 0;
    }
    weakFuncRef = Func::GetWeakFuncRef(pFVar1);
    if (weakFuncRef == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1538,"(weakFuncRef)","weakFuncRef");
      if (!bVar4) goto LAB_005cd967;
      *puVar8 = 0;
      weakFuncRef = 0;
    }
  }
  pLVar12 = IR::LabelInstr::New(Label,pFVar1,false);
  GenerateProfiledNewScObjArrayFastPath
            (this,&instr->super_Instr,arrayInfo,arrayInfoAddr,weakFuncRef,0,pLVar12,true);
  IR::Instr::InsertAfter(&instr->super_Instr,&pLVar12->super_Instr);
  pLVar11 = (Lowerer *)&this->m_lowererMD;
  pAVar13 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,pFVar1,false,
                              (Var)0x0);
  LowererMD::LoadHelperArgument((LowererMD *)pLVar11,&instr->super_Instr,&pAVar13->super_Opnd);
  pAVar13 = IR::AddrOpnd::New(arrayInfoAddr,AddrOpndKindDynamicArrayCallSiteInfo,pFVar1,false,
                              (Var)0x0);
  LowererMD::LoadHelperArgument((LowererMD *)pLVar11,&instr->super_Instr,&pAVar13->super_Opnd);
  LoadScriptContext(this,&instr->super_Instr);
  LowererMD::LoadHelperArgument((LowererMD *)pLVar11,&instr->super_Instr,(Opnd *)this_00);
  IR::Instr::UnlinkSrc1(&instr->super_Instr);
  this_01 = IR::HelperCallOpnd::New(HelperScrArr_ProfiledNewInstanceNoArg,pFVar1);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_005cd967;
    *puVar8 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_005cd967:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  bVar5 = (this_01->super_Opnd).field_0xb;
  if ((bVar5 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar1);
    bVar5 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar5 | 2;
  (instr->super_Instr).m_src1 = &this_01->super_Opnd;
  LowererMD::LowerCall((LowererMD *)pLVar11,&instr->super_Instr,0);
  pIVar14 = RemoveLoweredRegionStartMarker(pLVar11,local_48);
  return pIVar14;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObjArrayNoArg(IR::Instr *newObjInstr)
{
    IR::Opnd *targetOpnd = newObjInstr->GetSrc1();
    Func *func = newObjInstr->m_func;

    IR::Instr* startMarkerInstr = nullptr;

    if (!targetOpnd->IsAddrOpnd())
    {
        if (!newObjInstr->HasBailOutInfo() || newObjInstr->OnlyHasLazyBailOut())
        {
            return this->LowerNewScObject(newObjInstr, true, false);
        }

        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

        // For whatever reason, we couldn't do a fixed function check on the call target.
        // Generate a runtime check on the target.
        Assert(
            newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray ||
            newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)
        );
        IR::LabelInstr *labelSkipBailOut = IR::LabelInstr::New(Js::OpCode::Label, func);
        InsertCompareBranch(
            targetOpnd,
            LoadLibraryValueOpnd(newObjInstr, LibraryValue::ValueArrayConstructor),
            Js::OpCode::BrEq_A,
            true,
            labelSkipBailOut,
            newObjInstr);

        IR::ProfiledInstr *instrNew = IR::ProfiledInstr::New(newObjInstr->m_opcode, newObjInstr->UnlinkDst(), newObjInstr->UnlinkSrc1(), func);
        instrNew->u.profileId = newObjInstr->AsProfiledInstr()->u.profileId;
        newObjInstr->InsertAfter(instrNew);
        newObjInstr->m_opcode = Js::OpCode::BailOut;
        GenerateBailOut(newObjInstr);

        instrNew->InsertBefore(labelSkipBailOut);
        newObjInstr = instrNew;
    }
    else
    {
        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);
    }

    Assert(newObjInstr->IsProfiledInstr());

    intptr_t weakFuncRef = 0;
    intptr_t arrayInfoAddr = 0;
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    Js::ProfileId profileId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);
    if (profileId != Js::Constants::NoProfileId)
    {
        arrayInfo = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        arrayInfoAddr = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);
        Assert(arrayInfo);
        weakFuncRef = func->GetWeakFuncRef();
        Assert(weakFuncRef);
    }

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    GenerateProfiledNewScObjArrayFastPath(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, 0, labelDone, true);
    newObjInstr->InsertAfter(labelDone);

    m_lowererMD.LoadHelperArgument(newObjInstr, IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, func));
    m_lowererMD.LoadHelperArgument(newObjInstr, IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, func));

    LoadScriptContext(newObjInstr);

    m_lowererMD.LoadHelperArgument(newObjInstr, targetOpnd);
    newObjInstr->UnlinkSrc1();
    newObjInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperScrArr_ProfiledNewInstanceNoArg, func));
    m_lowererMD.LowerCall(newObjInstr, 0);

    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}